

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O1

void GetOption(TidyDoc tdoc,TidyOption topt,OptionDesc *d)

{
  TidyOptionId optId;
  TidyOptionType TVar1;
  TidyConfigCategory TVar2;
  ctmbstr ptVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  TidyOption p_Var7;
  TidyOption p_Var8;
  TidyDoc tdoc_00;
  long *plVar9;
  uint uVar10;
  TidyIterator pos;
  OptionDesc OStack_420;
  TidyOption p_Stack_398;
  long alStack_390 [103];
  OptionDesc *pOStack_58;
  TidyOption p_Stack_50;
  TidyDoc p_Stack_48;
  code *pcStack_40;
  TidyIterator local_30;
  
  pcStack_40 = (code *)0x13274e;
  p_Var8 = topt;
  optId = tidyOptGetId(topt);
  pcStack_40 = (code *)0x132759;
  TVar1 = tidyOptGetType(topt);
  pcStack_40 = (code *)0x132763;
  ptVar3 = tidyOptGetName(topt);
  d->name = ptVar3;
  pcStack_40 = (code *)0x13276e;
  TVar2 = tidyOptGetCategory(topt);
  tdoc_00 = (TidyDoc)(ulong)TVar2;
  if (0xb < TVar2 - TidyDiagnostics) {
    pcStack_40 = ForEachSortedOption;
    GetOption_cold_1();
    pOStack_58 = d;
    p_Stack_50 = topt;
    p_Stack_48 = tdoc;
    pcStack_40 = (code *)(ulong)optId;
    OStack_420.name = (ctmbstr)tidyGetOptionList(tdoc_00);
    uVar4 = 0;
    if ((TidyIterator)OStack_420.name != (TidyIterator)0x0) {
      do {
        p_Var7 = tidyGetNextOption(tdoc_00,(TidyIterator *)&OStack_420);
        alStack_390[uVar4 - 1] = (long)p_Var7;
        uVar10 = (int)uVar4 + 1;
        uVar4 = (ulong)uVar10;
      } while ((TidyIterator)OStack_420.name != (TidyIterator)0x0);
      uVar4 = (ulong)uVar10;
    }
    alStack_390[uVar4 - 1] = 0;
    qsort(&p_Stack_398,uVar4,8,cmpOpt);
    if (p_Stack_398 != (TidyOption)0x0) {
      plVar9 = alStack_390;
      do {
        GetOption(tdoc_00,p_Stack_398,&OStack_420);
        (*(code *)p_Var8)(tdoc_00,plVar9[-1],&OStack_420);
        p_Stack_398 = (TidyOption)*plVar9;
        plVar9 = plVar9 + 1;
      } while (p_Stack_398 != (TidyOption)0x0);
    }
    return;
  }
  pcStack_40 = (code *)0x132786;
  ptVar3 = tidyErrorCodeAsKey(TVar2);
  d->cat = ptVar3;
  pcStack_40 = (code *)0x132792;
  TVar2 = tidyOptGetCategory(topt);
  d->catid = TVar2;
  d->vals = (ctmbstr)0x0;
  d->def = (ctmbstr)0x0;
  d->haveVals = yes;
  uVar4 = (ulong)(optId - TidyBlockTags);
  if (optId - TidyBlockTags < 0x3e) {
    if ((0x1000000400010001U >> (uVar4 & 0x3f) & 1) != 0) {
      d->type = "Tag Names";
      pcVar5 = "tagX, tagY, ...";
LAB_00132817:
      d->vals = pcVar5;
      d->def = (ctmbstr)0x0;
      return;
    }
    if ((0x80000020000008U >> (uVar4 & 0x3f) & 1) != 0) {
      d->type = "Encoding";
      pcStack_40 = (code *)0x1327e9;
      ptVar3 = tidyOptGetEncName(tdoc,optId);
      pcVar5 = anon_var_dwarf_1bbaa + 0x41;
      if (ptVar3 != (ctmbstr)0x0) {
        pcVar5 = ptVar3;
      }
      d->def = pcVar5;
      d->vals = (ctmbstr)0x0;
      return;
    }
    if (uVar4 == 0x3d) {
      d->type = "Attributes Names";
      pcVar5 = "attributeX, attributeY, ...";
      goto LAB_00132817;
    }
  }
  if (TVar1 == TidyString) {
    d->type = "String";
    d->vals = (ctmbstr)0x0;
    d->haveVals = no;
    pcStack_40 = (code *)0x1328cb;
    ptVar3 = tidyOptGetValue(tdoc,optId);
  }
  else {
    if (TVar1 == TidyInteger) {
      pcStack_40 = (code *)0x132869;
      TVar1 = tidyOptGetType(topt);
      if (TVar1 != TidyInteger) {
LAB_001328d4:
        d->type = "Integer";
        pcVar5 = "0, 1, 2, ...";
        if (optId == TidyWrapLen) {
          pcVar5 = "0 (no wrapping), 1, 2, ...";
        }
        d->vals = pcVar5;
        pcStack_40 = (code *)0x132904;
        uVar6 = tidyOptGetInt(tdoc,optId);
        pcStack_40 = (code *)0x13291b;
        sprintf(d->tempdefs,"%u",uVar6 & 0xffffffff);
        d->def = d->tempdefs;
        return;
      }
      pcStack_40 = (code *)0x132876;
      local_30 = tidyOptGetPickList(topt);
      pcStack_40 = (code *)0x132886;
      ptVar3 = tidyOptGetNextPick(topt,&local_30);
      if (ptVar3 == (ctmbstr)0x0) goto LAB_001328d4;
      pcVar5 = "Enum";
    }
    else {
      if (TVar1 != TidyBoolean) {
        return;
      }
      pcVar5 = "Boolean";
    }
    d->type = pcVar5;
    pcStack_40 = (code *)0x1328a1;
    ptVar3 = tidyOptGetCurrPick(tdoc,optId);
  }
  d->def = ptVar3;
  return;
}

Assistant:

static void GetOption(TidyDoc tdoc,    /**< The tidy document. */
                      TidyOption topt, /**< The option to create a description for. */
                      OptionDesc *d    /**< [out] The new option description. */
                      )
{
    TidyOptionId optId = tidyOptGetId( topt );
    TidyOptionType optTyp = tidyOptGetType( topt );

    d->name = tidyOptGetName( topt );
    d->cat = ConfigCategoryId( tidyOptGetCategory( topt ) );
    d->catid = tidyOptGetCategory( topt );
    d->vals = NULL;
    d->def = NULL;
    d->haveVals = yes;

    /* Handle special cases first. */
    switch ( optId )
    {
        case TidyInlineTags:
        case TidyBlockTags:
        case TidyEmptyTags:
        case TidyPreTags:
            d->type = "Tag Names";
            d->vals = "tagX, tagY, ...";
            d->def = NULL;
            break;

        case TidyPriorityAttributes:
            d->type = "Attributes Names";
            d->vals = "attributeX, attributeY, ...";
            d->def = NULL;
            break;
            
        case TidyCharEncoding:
        case TidyInCharEncoding:
        case TidyOutCharEncoding:
            d->type = "Encoding";
            d->def = tidyOptGetEncName( tdoc, optId );
            if (!d->def)
                d->def = "?";
            d->vals = NULL;
            break;
            
            /* General case will handle remaining */
        default:
            switch ( optTyp )
        {
            case TidyBoolean:
                d->type = "Boolean";
                d->def = tidyOptGetCurrPick( tdoc, optId );
                break;
                
            case TidyInteger:
                if (hasPickList(topt))
                {
                    d->type = "Enum";
                    d->def = tidyOptGetCurrPick( tdoc, optId );
                }
                else
                {
                    uint idef;
                    d->type = "Integer";
                    if ( optId == TidyWrapLen )
                        d->vals = "0 (no wrapping), 1, 2, ...";
                    else
                        d->vals = "0, 1, 2, ...";
                    
                    idef = tidyOptGetInt( tdoc, optId );
                    sprintf(d->tempdefs, "%u", idef);
                    d->def = d->tempdefs;
                }
                break;
                
            case TidyString:
                d->type = "String";
                d->vals = NULL;
                d->haveVals = no;
                d->def = tidyOptGetValue( tdoc, optId );
                break;
        }
    }
}